

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_string *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  string *psVar1;
  _Base_ptr __lhs;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint32_t uVar5;
  ostream *poVar6;
  size_type sVar7;
  mapped_type *this;
  _Base_ptr p_Var8;
  Property *args;
  char *pcVar9;
  Property *args_1;
  Property *args_2;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  allocator local_5ca;
  allocator local_5c9;
  string *local_5c8;
  Property *local_5c0;
  _Base_ptr local_5b8;
  key_type local_5b0;
  AttrMetas *local_590;
  UsdPrimvarReader_string *local_588;
  Property *local_580;
  _Base_ptr local_578;
  _Base_ptr local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  ParseResult ret_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ParseResult sret;
  undefined1 local_4a8 [32];
  ParseResult ret;
  string local_2f0;
  string local_2d0 [32];
  ostringstream ss_e;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5c8 = err;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&ss_e,"info:id",(allocator *)&ret);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_578 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_580 = (Property *)&preader->varname;
  local_590 = &(preader->result)._metas;
  local_588 = preader;
  while( true ) {
    if (p_Var8 == local_578) break;
    local_5b8 = p_Var8 + 1;
    ::std::__cxx11::string::string(local_2d0,(string *)local_5b8);
    local_570 = p_Var8;
    ::std::__cxx11::string::string((string *)&ss_e,"inputs:fallback",(allocator *)&ret_1);
    args_1 = (Property *)&ss_e;
    args_2 = (Property *)&preader->fallback;
    local_5c0 = (Property *)(p_Var8 + 2);
    (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
              (&ret,(_anonymous_namespace_ *)&table,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d0,(string *)(p_Var8 + 2),(Property *)&ss_e,(string *)&preader->fallback,
               in_stack_fffffffffffffa28);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    p_Var8 = local_570;
    __lhs = local_5b8;
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar2 = false;
      iVar4 = 3;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x112a);
        ::std::operator<<(poVar6," ");
        ::std::__cxx11::string::string
                  ((string *)&sret,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&local_568);
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ret_1,(fmt *)&sret,(string *)"inputs:fallback",(char (*) [16])&ret.err
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_1);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_5c8;
        if (local_5c8 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ret_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&sret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar1);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar2 = false;
        iVar4 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:varname",(allocator *)&ret);
        sVar7 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar7 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&ss_e);
          ::std::__cxx11::string::string((string *)&local_2f0,(string *)__lhs);
          ::std::__cxx11::string::string((string *)&ret,"inputs:varname",(allocator *)&sret);
          args_1 = (Property *)&ret;
          args_2 = (Property *)&ss_e;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret_1,&table,&local_2f0,local_5c0,(string *)&ret,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret_1.code == TypeMismatch) {
            ::std::__cxx11::string::string((string *)local_4a8,(string *)__lhs);
            ::std::__cxx11::string::string((string *)&ret,"inputs:varname",(allocator *)&local_568);
            args = local_5c0;
            args_1 = (Property *)&ret;
            args_2 = local_580;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      (&sret,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4a8,(string *)local_5c0,(Property *)&ret,(string *)local_580,
                       in_stack_fffffffffffffa28);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar4 = 3;
            if (sret.code != Success) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ret);
              poVar6 = ::std::operator<<((ostream *)&ret,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1143);
              ::std::operator<<(poVar6," ");
              ::std::__cxx11::string::string
                        ((string *)&local_5b0,"Faied to parse inputs:varname: {}",&local_5ca);
              fmt::format<std::__cxx11::string>
                        (&local_568,(fmt *)&local_5b0,(string *)&sret.err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar6 = ::std::operator<<((ostream *)&ret,(string *)&local_568);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar1 = local_5c8;
              if (local_5c8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_568,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_5b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar1);
                ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_568);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ret);
              iVar4 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar4 = 0;
            if (ret_1.code == Success) {
              bVar2 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&ss_e,
                                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_580);
              iVar4 = 3;
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ret);
                poVar6 = ::std::operator<<((ostream *)&ret,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1131);
                ::std::operator<<(poVar6," ");
                poVar6 = ::std::operator<<((ostream *)&ret,
                                           "Failed to convert inputs:varname token type to string type."
                                          );
                ::std::operator<<(poVar6,"\n");
                psVar1 = local_5c8;
                if (local_5c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&sret,&local_568,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar1);
                  ::std::__cxx11::string::operator=((string *)psVar1,(string *)&sret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ret);
                iVar4 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&ss_e);
          if (iVar4 != 0) goto LAB_001dd889;
        }
      }
      ::std::__cxx11::string::string((string *)&stack0xfffffffffffffcf0,(string *)__lhs);
      ::std::__cxx11::string::string((string *)&local_5b0,"outputs:result",&local_5c9);
      ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
      ret.err._M_string_length = 0;
      ret.err.field_2._M_local_buf[0] = '\0';
      iVar4 = ::std::__cxx11::string::compare((string *)&stack0xfffffffffffffcf0);
      if (iVar4 == 0) {
        sVar7 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,&local_5b0);
        if (sVar7 == 0) {
          bVar2 = Property::is_attribute_connection(local_5c0);
          if (bVar2) {
            ret.code = ConnectionNotAllowed;
            ::std::__cxx11::string::assign((char *)&ret.err);
          }
          else if (*(int *)((long)&p_Var8[0x17]._M_parent + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)&ss_e,&local_5c0->_attrib);
            bVar2 = tinyusdz::value::IsRoleType((string *)&ss_e);
            local_5b8 = (_Base_ptr)CONCAT71(local_5b8._1_7_,bVar2);
            tinyusdz::value::
            TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::type_name();
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret_1,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (_Var3) {
              (local_588->result)._authored = true;
              AttrMetas::operator=(local_590,(AttrMetas *)(p_Var8 + 7));
LAB_001dd4af:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_5b0);
              ret.code = Success;
            }
            else {
              if ((char)local_5b8 == '\0') {
                pcVar9 = "Property type mismatch. {} expects type `{}` but defined as type `{}`.";
              }
              else {
                uVar5 = tinyusdz::value::GetUnderlyingTypeId((string *)&ss_e);
                if (uVar5 == 7) {
                  (local_588->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)&(preader->result)._actual_type_name);
                  AttrMetas::operator=(local_590,(AttrMetas *)(p_Var8 + 7));
                  goto LAB_001dd4af;
                }
                pcVar9 = 
                "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                ;
              }
              ret.code = TypeMismatch;
              ::std::__cxx11::string::string((string *)&sret,pcVar9,&local_5ca);
              tinyusdz::value::
              TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::type_name();
              args_1 = (Property *)&ss_e;
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&ret_1,(fmt *)&sret,&local_5b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_568,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2
                        );
              ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ret_1);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InvalidConnection;
          }
        }
        else {
          ret.code = AlreadyProcessed;
        }
      }
      else {
        ret.code = Unmatched;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar4 = 3;
LAB_001dd708:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1149);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&sret,"Parsing shader output property `{}` failed. Error: {}",
                     (allocator *)&local_568);
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret_1,(fmt *)&sret,(string *)"outputs:result",
                     (char (*) [15])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_1);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c8;
          if (local_5c8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&sret,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret_1);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar4 = 1;
          goto LAB_001dd708;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001dd889;
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar7 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,(key_type *)__lhs)
        ;
        Property::operator=(this,local_5c0);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__lhs);
      if (sVar7 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[warn]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x114b);
        ::std::operator<<(poVar6," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ret_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_5c8);
          ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
    }
    else {
LAB_001dd889:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
    p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8);
  }
  bVar2 = p_Var8 == local_578;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar2;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_string>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_string *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_string,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_string, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_string, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}